

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_service.hpp
# Opt level: O0

results_type * __thiscall
asio::detail::resolver_service<asio::ip::tcp>::resolve
          (resolver_service<asio::ip::tcp> *this,implementation_type *param_2,query_type *qry,
          error_code *ec)

{
  bool bVar1;
  socket_ops *this_00;
  char *__name;
  addrinfo_type *__service;
  basic_resolver_query<asio::ip::tcp> *in_RCX;
  results_type *in_RDI;
  addrinfo_type *in_R8;
  auto_addrinfo auto_address_info;
  addrinfo_type *address_info;
  basic_resolver_query<asio::ip::tcp> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  string *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *host_name;
  
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  ip::basic_resolver_query<asio::ip::tcp>::host_name_abi_cxx11_(in_stack_fffffffffffffec8);
  this_00 = (socket_ops *)
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15fe9c
                      );
  ip::basic_resolver_query<asio::ip::tcp>::service_name_abi_cxx11_(in_stack_fffffffffffffec8);
  __name = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15fec5)
  ;
  __service = ip::basic_resolver_query<asio::ip::tcp>::hints(in_RCX);
  socket_ops::getaddrinfo
            (this_00,__name,(char *)__service,(addrinfo *)&stack0xffffffffffffffd0,
             (addrinfo **)in_R8);
  std::__cxx11::string::~string(in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(in_stack_fffffffffffffed0);
  resolver_service_base::auto_addrinfo::auto_addrinfo
            ((auto_addrinfo *)in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->hints_);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_R8);
  if (bVar1) {
    ip::basic_resolver_results<asio::ip::tcp>::basic_resolver_results
              ((basic_resolver_results<asio::ip::tcp> *)0x15ff7b);
    this_01 = in_stack_fffffffffffffed0;
  }
  else {
    host_name = this_01;
    ip::basic_resolver_query<asio::ip::tcp>::host_name_abi_cxx11_(in_stack_fffffffffffffec8);
    ip::basic_resolver_query<asio::ip::tcp>::service_name_abi_cxx11_(in_stack_fffffffffffffec8);
    ip::basic_resolver_results<asio::ip::tcp>::create(in_R8,host_name,in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(this_01);
  }
  resolver_service_base::auto_addrinfo::~auto_addrinfo((auto_addrinfo *)this_01);
  return in_RDI;
}

Assistant:

results_type resolve(implementation_type&, const query_type& qry,
      asio::error_code& ec)
  {
    asio::detail::addrinfo_type* address_info = 0;

    socket_ops::getaddrinfo(qry.host_name().c_str(),
        qry.service_name().c_str(), qry.hints(), &address_info, ec);
    auto_addrinfo auto_address_info(address_info);

    ASIO_ERROR_LOCATION(ec);
    return ec ? results_type() : results_type::create(
        address_info, qry.host_name(), qry.service_name());
  }